

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_callermsg(lua_State *L,char *msg)

{
  TValue *pTVar1;
  TValue *pTVar2;
  lua_State *in_RDI;
  TValue *pframe;
  TValue *frame;
  char *in_stack_00000028;
  lua_State *in_stack_00000030;
  
  pTVar1 = in_RDI->base;
  pTVar2 = pTVar1 + -1;
  if ((((((ulong)*pTVar1 & 0x300000000) != 0) && (((ulong)*pTVar1 & 0x700000000) == 0x200000000)) &&
      (pTVar1[-2].u32.lo != 1)) &&
     ((0xa7 < *(byte *)((ulong)(pTVar2->u32).lo + 6) &&
      (*(byte *)((ulong)(pTVar2->u32).lo + 6) < 0xb8)))) {
    in_RDI->base = (TValue *)
                   ((long)pTVar2 + (8 - (long)(int)(*(uint *)((long)pTVar1 + -4) & 0xfffffff8)));
    in_RDI->top = pTVar2;
    *(undefined4 *)(((ulong)in_RDI->cframe & 0xfffffffffffffffc) + 0x1c) =
         *(undefined4 *)((long)pTVar1 + -0xc);
  }
  lj_debug_addloc(in_stack_00000030,in_stack_00000028,(cTValue *)L,(cTValue *)msg);
  lj_err_run(in_RDI);
}

Assistant:

LJ_NOINLINE void lj_err_callermsg(lua_State *L, const char *msg)
{
  TValue *frame = L->base-1;
  TValue *pframe = NULL;
  if (frame_islua(frame)) {
    pframe = frame_prevl(frame);
  } else if (frame_iscont(frame)) {
#if LJ_HASFFI
    if ((frame-1)->u32.lo == LJ_CONT_FFI_CALLBACK) {
      pframe = frame;
      frame = NULL;
    } else
#endif
    {
      pframe = frame_prevd(frame);
#if LJ_HASFFI
      /* Remove frame for FFI metamethods. */
      if (frame_func(frame)->c.ffid >= FF_ffi_meta___index &&
	  frame_func(frame)->c.ffid <= FF_ffi_meta___tostring) {
	L->base = pframe+1;
	L->top = frame;
	setcframe_pc(cframe_raw(L->cframe), frame_contpc(frame));
      }
#endif
    }
  }
  lj_debug_addloc(L, msg, pframe, frame);
  lj_err_run(L);
}